

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase628::run(TestCase628 *this)

{
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  Builder root;
  MallocMessageBuilder builder;
  undefined1 local_328 [36];
  ushort uStack_304;
  ElementSize EStack_302;
  undefined1 uStack_301;
  ListElementCount local_300;
  OrphanBuilder local_2f8;
  StructBuilder local_2d8;
  ListBuilder local_2a8;
  StructBuilder local_280;
  WirePointer *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  SegmentBuilder *in_stack_fffffffffffffdd0;
  CapTableBuilder *in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  undefined1 local_208 [40];
  StructBuilder local_1e0;
  StructReader local_1b8;
  StructReader local_188;
  StructReader local_158;
  StructReader local_128;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_2a8,&local_f8.super_MessageBuilder);
  local_328._16_8_ = local_2a8.ptr;
  PointerBuilder::initStruct(&local_2d8,(PointerBuilder *)local_328,(StructSize)0x140006);
  local_328._32_4_ = local_2d8.dataSize;
  uStack_304 = local_2d8.pointerCount;
  EStack_302 = local_2d8._38_1_;
  uStack_301 = local_2d8._39_1_;
  local_328._16_8_ = local_2d8.data;
  local_328._24_8_ = local_2d8.pointers;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  pBVar1 = StructBuilder::getArena((StructBuilder *)local_328);
  pCVar2 = StructBuilder::getCapTable((StructBuilder *)local_328);
  OrphanBuilder::initStruct((OrphanBuilder *)local_328,pBVar1,pCVar2,(StructSize)0x140006);
  local_2f8.segment = (SegmentBuilder *)local_328._8_8_;
  local_2f8.capTable = (CapTableBuilder *)local_328._16_8_;
  local_2f8.location = (word *)local_328._24_8_;
  local_2f8.tag.content = local_328._0_8_;
  OrphanBuilder::asStruct(&local_1e0,&local_2f8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdc8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdc0;
  builder_00._builder.data = in_stack_fffffffffffffdd0;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffdd8;
  builder_00._builder._32_8_ = in_stack_fffffffffffffde0;
  initTestMessage(builder_00);
  local_328._16_8_ = local_2d8.pointers + 2;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  PointerBuilder::adopt((PointerBuilder *)local_328,&local_2f8);
  StructBuilder::asReader(&local_2d8);
  local_2a8.ptr = (byte *)(local_328._24_8_ + 0x10);
  if (uStack_304 < 3) {
    local_2a8.ptr = (byte *)(WirePointer *)0x0;
  }
  if (uStack_304 < 3) {
    local_2a8.segment._0_4_ = 0;
    local_2a8.segment._4_4_ = 0;
    local_2a8.capTable._0_4_ = 0;
    local_2a8.capTable._4_4_ = 0;
    local_2a8.elementCount = 0x7fffffff;
  }
  else {
    local_2a8.segment._0_4_ = local_328._0_4_;
    local_2a8.segment._4_4_ = local_328._4_4_;
    local_2a8.capTable._0_4_ = local_328._8_4_;
    local_2a8.capTable._4_4_ = local_328._12_4_;
    local_2a8.elementCount = local_300;
  }
  PointerReader::getStruct(&local_128,(PointerReader *)&local_2a8,(word *)0x0);
  reader._reader.capTable = local_128.capTable;
  reader._reader.segment = local_128.segment;
  reader._reader.data = local_128.data;
  reader._reader.pointers = local_128.pointers;
  reader._reader.dataSize = local_128.dataSize;
  reader._reader.pointerCount = local_128.pointerCount;
  reader._reader._38_2_ = local_128._38_2_;
  reader._reader.nestingLimit = local_128.nestingLimit;
  reader._reader._44_4_ = local_128._44_4_;
  checkTestMessage(reader);
  if (local_2f8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2f8);
  }
  local_328._16_8_ = local_2d8.pointers + 4;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  PointerBuilder::initList((ListBuilder *)local_208,(PointerBuilder *)local_328,BIT,3);
  local_328._32_4_ = local_208._32_4_;
  uStack_304 = local_208._36_2_;
  EStack_302 = local_208[0x26];
  uStack_301 = local_208[0x27];
  local_328._16_8_ = local_208._16_8_;
  local_328._24_8_ = local_208._24_8_;
  local_328._0_8_ = local_208._0_8_;
  local_328._8_8_ = local_208._8_8_;
  pBVar1 = ListBuilder::getArena((ListBuilder *)local_328);
  pCVar2 = ListBuilder::getCapTable((ListBuilder *)local_328);
  OrphanBuilder::initStruct((OrphanBuilder *)local_328,pBVar1,pCVar2,(StructSize)0x140006);
  local_2f8.segment = (SegmentBuilder *)local_328._8_8_;
  local_2f8.capTable = (CapTableBuilder *)local_328._16_8_;
  local_2f8.location = (word *)local_328._24_8_;
  local_2f8.tag.content = local_328._0_8_;
  OrphanBuilder::asStruct((StructBuilder *)&stack0xfffffffffffffdd0,&local_2f8,(StructSize)0x140006)
  ;
  builder_01._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdc8;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdc0;
  builder_01._builder.data = in_stack_fffffffffffffdd0;
  builder_01._builder.pointers = (WirePointer *)in_stack_fffffffffffffdd8;
  builder_01._builder._32_8_ = in_stack_fffffffffffffde0;
  initTestMessage(builder_01);
  local_328._16_8_ = local_2d8.pointers + 2;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  PointerBuilder::adopt((PointerBuilder *)local_328,&local_2f8);
  StructBuilder::asReader(&local_2d8);
  local_2a8.ptr = (byte *)(local_328._24_8_ + 0x10);
  if (uStack_304 < 3) {
    local_2a8.ptr = (byte *)(WirePointer *)0x0;
  }
  if (uStack_304 < 3) {
    local_2a8.segment._0_4_ = 0;
    local_2a8.segment._4_4_ = 0;
    local_2a8.capTable._0_4_ = 0;
    local_2a8.capTable._4_4_ = 0;
    local_2a8.elementCount = 0x7fffffff;
  }
  else {
    local_2a8.segment._0_4_ = local_328._0_4_;
    local_2a8.segment._4_4_ = local_328._4_4_;
    local_2a8.capTable._0_4_ = local_328._8_4_;
    local_2a8.capTable._4_4_ = local_328._12_4_;
    local_2a8.elementCount = local_300;
  }
  PointerReader::getStruct(&local_158,(PointerReader *)&local_2a8,(word *)0x0);
  reader_00._reader.capTable = local_158.capTable;
  reader_00._reader.segment = local_158.segment;
  reader_00._reader.data = local_158.data;
  reader_00._reader.pointers = local_158.pointers;
  reader_00._reader.dataSize = local_158.dataSize;
  reader_00._reader.pointerCount = local_158.pointerCount;
  reader_00._reader._38_2_ = local_158._38_2_;
  reader_00._reader.nestingLimit = local_158.nestingLimit;
  reader_00._reader._44_4_ = local_158._44_4_;
  checkTestMessage(reader_00);
  if (local_2f8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2f8);
  }
  local_328._32_4_ = local_2d8.dataSize;
  uStack_304 = local_2d8.pointerCount;
  EStack_302 = local_2d8._38_1_;
  uStack_301 = local_2d8._39_1_;
  local_328._16_8_ = local_2d8.data;
  local_328._24_8_ = local_2d8.pointers;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  pBVar1 = StructBuilder::getArena((StructBuilder *)local_328);
  pCVar2 = StructBuilder::getCapTable((StructBuilder *)local_328);
  OrphanBuilder::initStruct((OrphanBuilder *)local_328,pBVar1,pCVar2,(StructSize)0x140006);
  local_2f8.segment = (SegmentBuilder *)local_328._8_8_;
  local_2f8.capTable = (CapTableBuilder *)local_328._16_8_;
  local_2f8.location = (word *)local_328._24_8_;
  local_2f8.tag.content = local_328._0_8_;
  OrphanBuilder::asStruct((StructBuilder *)&stack0xfffffffffffffda8,&local_2f8,(StructSize)0x140006)
  ;
  builder_02._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdc8;
  builder_02._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdc0;
  builder_02._builder.data = in_stack_fffffffffffffdd0;
  builder_02._builder.pointers = (WirePointer *)in_stack_fffffffffffffdd8;
  builder_02._builder._32_8_ = in_stack_fffffffffffffde0;
  initTestMessage(builder_02);
  local_328._16_8_ = local_2d8.pointers + 2;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  PointerBuilder::adopt((PointerBuilder *)local_328,&local_2f8);
  StructBuilder::asReader(&local_2d8);
  local_2a8.ptr = (byte *)(local_328._24_8_ + 0x10);
  if (uStack_304 < 3) {
    local_2a8.ptr = (byte *)(WirePointer *)0x0;
  }
  if (uStack_304 < 3) {
    local_2a8.segment._0_4_ = 0;
    local_2a8.segment._4_4_ = 0;
    local_2a8.capTable._0_4_ = 0;
    local_2a8.capTable._4_4_ = 0;
    local_2a8.elementCount = 0x7fffffff;
  }
  else {
    local_2a8.segment._0_4_ = local_328._0_4_;
    local_2a8.segment._4_4_ = local_328._4_4_;
    local_2a8.capTable._0_4_ = local_328._8_4_;
    local_2a8.capTable._4_4_ = local_328._12_4_;
    local_2a8.elementCount = local_300;
  }
  PointerReader::getStruct(&local_188,(PointerReader *)&local_2a8,(word *)0x0);
  reader_01._reader.capTable = local_188.capTable;
  reader_01._reader.segment = local_188.segment;
  reader_01._reader.data = local_188.data;
  reader_01._reader.pointers = local_188.pointers;
  reader_01._reader.dataSize = local_188.dataSize;
  reader_01._reader.pointerCount = local_188.pointerCount;
  reader_01._reader._38_2_ = local_188._38_2_;
  reader_01._reader.nestingLimit = local_188.nestingLimit;
  reader_01._reader._44_4_ = local_188._44_4_;
  checkTestMessage(reader_01);
  if (local_2f8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2f8);
  }
  local_328._16_8_ = local_2d8.pointers + 4;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  PointerBuilder::initList(&local_2a8,(PointerBuilder *)local_328,BIT,3);
  ListSchema::of(BOOL);
  local_328._32_4_ = local_2a8.structDataSize;
  uStack_304 = local_2a8.structPointerCount;
  EStack_302 = local_2a8.elementSize;
  uStack_301 = local_2a8._39_1_;
  local_328._0_8_ = CONCAT44(local_2a8.segment._4_4_,local_2a8.segment._0_4_);
  local_328._8_8_ = CONCAT44(local_2a8.capTable._4_4_,local_2a8.capTable._0_4_);
  local_328._24_8_ = CONCAT44(local_2a8.step,local_2a8.elementCount);
  local_328._16_8_ = local_2a8.ptr;
  pBVar1 = ListBuilder::getArena((ListBuilder *)local_328);
  pCVar2 = ListBuilder::getCapTable((ListBuilder *)local_328);
  OrphanBuilder::initStruct((OrphanBuilder *)local_328,pBVar1,pCVar2,(StructSize)0x140006);
  local_2f8.segment = (SegmentBuilder *)local_328._8_8_;
  local_2f8.capTable = (CapTableBuilder *)local_328._16_8_;
  local_2f8.location = (word *)local_328._24_8_;
  local_2f8.tag.content = local_328._0_8_;
  OrphanBuilder::asStruct(&local_280,&local_2f8,(StructSize)0x140006);
  builder_03._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdc8;
  builder_03._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdc0;
  builder_03._builder.data = in_stack_fffffffffffffdd0;
  builder_03._builder.pointers = (WirePointer *)in_stack_fffffffffffffdd8;
  builder_03._builder._32_8_ = in_stack_fffffffffffffde0;
  initTestMessage(builder_03);
  local_328._16_8_ = local_2d8.pointers + 2;
  local_328._0_8_ = local_2d8.segment;
  local_328._8_8_ = local_2d8.capTable;
  PointerBuilder::adopt((PointerBuilder *)local_328,&local_2f8);
  StructBuilder::asReader(&local_2d8);
  local_2a8.ptr = (byte *)(local_328._24_8_ + 0x10);
  if (uStack_304 < 3) {
    local_2a8.ptr = (byte *)(WirePointer *)0x0;
  }
  if (uStack_304 < 3) {
    local_2a8.segment._0_4_ = 0;
    local_2a8.segment._4_4_ = 0;
    local_2a8.capTable._0_4_ = 0;
    local_2a8.capTable._4_4_ = 0;
    local_300 = 0x7fffffff;
  }
  else {
    local_2a8.segment._0_4_ = local_328._0_4_;
    local_2a8.segment._4_4_ = local_328._4_4_;
    local_2a8.capTable._0_4_ = local_328._8_4_;
    local_2a8.capTable._4_4_ = local_328._12_4_;
  }
  local_2a8.elementCount = local_300;
  PointerReader::getStruct(&local_1b8,(PointerReader *)&local_2a8,(word *)0x0);
  reader_02._reader.capTable = local_1b8.capTable;
  reader_02._reader.segment = local_1b8.segment;
  reader_02._reader.data = local_1b8.data;
  reader_02._reader.pointers = local_1b8.pointers;
  reader_02._reader.dataSize = local_1b8.dataSize;
  reader_02._reader.pointerCount = local_1b8.pointerCount;
  reader_02._reader._38_2_ = local_1b8._38_2_;
  reader_02._reader.nestingLimit = local_1b8.nestingLimit;
  reader_02._reader._44_4_ = local_1b8._44_4_;
  checkTestMessage(reader_02);
  if (local_2f8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_2f8);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(Orphans, OrphanageFromBuilder) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(root);
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(root.initBoolList(3));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

#if !CAPNP_LITE
  {
    Orphanage orphanage = Orphanage::getForMessageContaining(toDynamic(root));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }

  {
    Orphanage orphanage = Orphanage::getForMessageContaining(toDynamic(root.initBoolList(3)));
    Orphan<TestAllTypes> orphan = orphanage.newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    root.adoptStructField(kj::mv(orphan));
    checkTestMessage(root.asReader().getStructField());
  }
#endif  // !CAPNP_LITE
}